

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void simple_motion_search_prune_part_features
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,int mi_row,int mi_col,
               BLOCK_SIZE bsize,float *features,int features_to_get)

{
  SIMPLE_MOTION_DATA_TREE *sms_tree_00;
  long lVar1;
  MB_MODE_INFO *pMVar2;
  MB_MODE_INFO *pMVar3;
  uint uVar4;
  BLOCK_SIZE BVar5;
  int16_t iVar6;
  int mi_ext_col;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  byte bVar16;
  undefined7 in_register_00000089;
  byte bVar17;
  uint plane_end;
  int r_idx;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  uint *in_stack_ffffffffffffff78;
  int ref_list [1];
  uint local_7c;
  uint local_48;
  
  local_7c = (uint)CONCAT71(in_register_00000089,bsize);
  uVar11 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar11];
  ref_list[0] = 7;
  if ((cpi->rc).is_src_frame_alt_ref == 0) {
    ref_list[0] = 1;
  }
  bVar17 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar11];
  uVar9 = (ulong)bsize;
  iVar8 = (int)sms_tree;
  if (((features_to_get & 1U) != 0) && (sms_tree->sms_none_valid == 0)) {
    simple_motion_search_get_best_ref
              (cpi,x,sms_tree,mi_row,mi_col,bsize,ref_list,1,iVar8 + 0x48,iVar8 + 0x4c,
               in_stack_ffffffffffffff78,(uint *)CONCAT44(local_7c,ref_list[0]));
    sms_tree->sms_none_valid = 1;
  }
  if ((features_to_get & 2U) != 0) {
    BVar5 = BLOCK_INVALID;
    switch(uVar9) {
    case 0:
      uVar18 = uVar9;
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 7:
    case 8:
      goto switchD_00a561b7_caseD_1;
    case 3:
      uVar18 = 1;
      break;
    case 6:
      uVar18 = 2;
      break;
    case 9:
      uVar18 = 3;
      break;
    default:
      if (bsize == BLOCK_64X64) {
        uVar18 = 4;
      }
      else {
        if (bsize != BLOCK_128X128) goto switchD_00a561b7_caseD_1;
        uVar18 = 5;
      }
    }
    BVar5 = subsize_lookup[3][uVar18];
switchD_00a561b7_caseD_1:
    uVar18 = 0;
    do {
      sms_tree_00 = sms_tree->split[uVar18];
      if (sms_tree_00->sms_none_valid == 0) {
        local_48 = (uint)bVar17;
        uVar15 = 0;
        if ((uVar18 & 1) != 0) {
          uVar15 = (uint)(bVar16 >> 1);
        }
        simple_motion_search_get_best_ref
                  (cpi,x,sms_tree_00,(((uint)(uVar18 >> 1) & 0x7fffffff) * local_48 >> 1) + mi_row,
                   uVar15 + mi_col,BVar5,ref_list,1,(int)sms_tree_00 + 0x48,(int)sms_tree_00 + 0x4c,
                   in_stack_ffffffffffffff78,(uint *)CONCAT44(local_7c,ref_list[0]));
        sms_tree_00->sms_none_valid = 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != 4);
  }
  if (((features_to_get & 4U) == 0) || (sms_tree->sms_rect_valid != 0)) goto LAB_00a56468;
  BVar5 = BLOCK_INVALID;
  switch(uVar9) {
  case 0:
    uVar18 = uVar9;
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_00a562ba_caseD_1;
  case 3:
    uVar18 = 1;
    break;
  case 6:
    uVar18 = 2;
    break;
  case 9:
    uVar18 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar18 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_00a562ba_caseD_1;
      uVar18 = 5;
    }
  }
  BVar5 = subsize_lookup[1][uVar18];
switchD_00a562ba_caseD_1:
  simple_motion_search_get_best_ref
            (cpi,x,sms_tree,mi_row,mi_col,BVar5,ref_list,0,iVar8 + 0x50,iVar8 + 0x54,
             in_stack_ffffffffffffff78,(uint *)CONCAT44(local_7c,ref_list[0]));
  simple_motion_search_get_best_ref
            (cpi,x,sms_tree,(uint)(bVar17 >> 1) + mi_row,mi_col,BVar5,ref_list,0,iVar8 + 0x58,
             iVar8 + 0x5c,in_stack_ffffffffffffff78,(uint *)CONCAT44(local_7c,ref_list[0]));
  BVar5 = BLOCK_INVALID;
  switch(uVar9) {
  case 0:
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_00a56393_caseD_1;
  case 3:
    uVar9 = 1;
    break;
  case 6:
    uVar9 = 2;
    break;
  case 9:
    uVar9 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      uVar9 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_00a56393_caseD_1;
      uVar9 = 5;
    }
  }
  BVar5 = subsize_lookup[2][uVar9];
switchD_00a56393_caseD_1:
  simple_motion_search_get_best_ref
            (cpi,x,sms_tree,mi_row,mi_col,BVar5,ref_list,0,iVar8 + 0x60,iVar8 + 100,
             in_stack_ffffffffffffff78,(uint *)CONCAT44(local_7c,ref_list[0]));
  simple_motion_search_get_best_ref
            (cpi,x,sms_tree,mi_row,(uint)(bVar16 >> 1) + mi_col,BVar5,ref_list,0,iVar8 + 0x68,
             iVar8 + 0x6c,in_stack_ffffffffffffff78,(uint *)CONCAT44(local_7c,ref_list[0]));
  sms_tree->sms_rect_valid = 1;
LAB_00a56468:
  if (features != (float *)0x0) {
    uVar9 = 0;
    if ((features_to_get & 1U) != 0) {
      fVar21 = log1pf((float)sms_tree->sms_none_feat[0]);
      *features = fVar21;
      fVar21 = log1pf((float)sms_tree->sms_none_feat[1]);
      features[1] = fVar21;
      uVar9 = 2;
    }
    if ((features_to_get & 2U) != 0) {
      lVar19 = 0;
      do {
        lVar1 = *(long *)((long)sms_tree->split + lVar19 * 4);
        fVar21 = log1pf((float)*(uint *)(lVar1 + 0x48));
        features[uVar9 + lVar19] = fVar21;
        fVar21 = log1pf((float)*(uint *)(lVar1 + 0x4c));
        features[uVar9 + lVar19 + 1] = fVar21;
        lVar19 = lVar19 + 2;
      } while (lVar19 != 8);
      uVar9 = (ulong)((int)uVar9 + 8);
    }
    if ((features_to_get & 4U) != 0) {
      lVar19 = 0;
      do {
        fVar21 = log1pf((float)sms_tree->sms_rect_feat[lVar19]);
        features[uVar9 + lVar19] = fVar21;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
      uVar9 = (ulong)((int)uVar9 + 8);
    }
    bVar20 = ((cpi->common).seq_params)->monochrome == '\0';
    plane_end = bVar20 + 1 + (uint)bVar20;
    iVar8 = (cpi->common).mi_params.mi_stride;
    iVar10 = mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [(cpi->common).mi_params.mi_alloc_bsize];
    iVar7 = mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [(cpi->common).mi_params.mi_alloc_bsize];
    iVar12 = iVar8 * mi_row + mi_col;
    (cpi->common).mi_params.mi_grid_base[iVar12] =
         (cpi->common).mi_params.mi_alloc +
         ((cpi->common).mi_params.mi_alloc_stride * iVar10 + iVar7);
    (x->e_mbd).mi = (cpi->common).mi_params.mi_grid_base + iVar12;
    (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar12;
    (x->e_mbd).tx_type_map_stride = iVar8;
    x->mbmi_ext_frame =
         (cpi->mbmi_ext_info).frame_base + (iVar10 * (cpi->mbmi_ext_info).stride + iVar7);
    lVar19 = 0;
    av1_setup_dst_planes
              ((x->e_mbd).plane,bsize,&((cpi->common).cur_frame)->buf,mi_row,mi_col,0,plane_end);
    iVar8 = (cpi->oxcf).border_in_pixels;
    iVar7 = (cpi->common).mi_params.mi_rows;
    iVar10 = (cpi->common).mi_params.mi_cols;
    iVar13 = 8 - (iVar8 + mi_row * 4);
    uVar15 = (uint)bVar17;
    iVar12 = (uVar15 + mi_row) * -4 + -8;
    if (iVar12 < iVar13) {
      iVar12 = iVar13;
    }
    iVar14 = iVar7 - mi_row;
    iVar13 = iVar14 * 4 + 8;
    iVar14 = iVar8 + (iVar14 - uVar15) * 4 + -8;
    if (iVar14 < iVar13) {
      iVar13 = iVar14;
    }
    (x->mv_limits).row_min = iVar12;
    (x->mv_limits).row_max = iVar13;
    iVar13 = 8 - (iVar8 + mi_col * 4);
    uVar4 = (uint)bVar16;
    iVar12 = (uVar4 + mi_col) * -4 + -8;
    if (iVar12 < iVar13) {
      iVar12 = iVar13;
    }
    (x->mv_limits).col_min = iVar12;
    iVar13 = iVar10 - mi_col;
    iVar12 = iVar8 + (iVar13 - uVar4) * 4 + -8;
    iVar8 = iVar13 * 4 + 8;
    if (iVar12 < iVar8) {
      iVar8 = iVar12;
    }
    (x->mv_limits).col_max = iVar8;
    do {
      bVar16 = (byte)((uVar15 << 2) >>
                     (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar19 + -0x28) & 0x1f));
      bVar17 = (byte)((uVar4 << 2) >>
                     (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar19 + -0x2c) & 0x1f));
      if (bVar17 < 5) {
        bVar17 = 4;
      }
      *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar19 + 0x90) = bVar17;
      if (bVar16 < 5) {
        bVar16 = 4;
      }
      *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar19 + 0x91) = bVar16;
      lVar19 = lVar19 + 0xa30;
    } while ((ulong)plane_end * 0xa30 - lVar19 != 0);
    (x->e_mbd).mi_row = mi_row;
    (x->e_mbd).mi_col = mi_col;
    (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
    (x->e_mbd).mb_to_bottom_edge = (iVar7 - (uVar15 + mi_row)) * 0x20;
    (x->e_mbd).mb_to_left_edge = mi_col * -0x20;
    (x->e_mbd).mb_to_right_edge = (iVar10 - (uVar4 + mi_col)) * 0x20;
    av1_setup_src_planes(x,cpi->source,mi_row,mi_col,plane_end,bsize);
    iVar6 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
    iVar8 = (int)iVar6 >> ((char)(x->e_mbd).bd - 8U & 0x1f);
    fVar21 = log1pf((float)(iVar8 * iVar8) * 0.00390625);
    lVar19 = (long)(int)uVar9;
    features[lVar19] = fVar21;
    pMVar2 = (x->e_mbd).left_mbmi;
    pMVar3 = (x->e_mbd).above_mbmi;
    if (pMVar3 != (MB_MODE_INFO *)0x0) {
      local_7c = (uint)pMVar3->bsize;
    }
    if (pMVar2 != (MB_MODE_INFO *)0x0) {
      uVar11 = (ulong)pMVar2->bsize;
    }
    fVar21 = 1.0;
    fVar22 = 1.0;
    if (pMVar3 == (MB_MODE_INFO *)0x0) {
      fVar22 = 0.0;
    }
    features[lVar19 + 1] = fVar22;
    features[lVar19 + 2] = (float)""[(byte)local_7c];
    features[lVar19 + 3] = (float)""[(byte)local_7c];
    if (pMVar2 == (MB_MODE_INFO *)0x0) {
      fVar21 = 0.0;
    }
    features[lVar19 + 4] = fVar21;
    features[lVar19 + 5] = (float)""[uVar11];
    features[lVar19 + 6] = (float)""[uVar11];
  }
  return;
}

Assistant:

static inline void simple_motion_search_prune_part_features(
    AV1_COMP *const cpi, MACROBLOCK *x, SIMPLE_MOTION_DATA_TREE *sms_tree,
    int mi_row, int mi_col, BLOCK_SIZE bsize, float *features,
    int features_to_get) {
  const int w_mi = mi_size_wide[bsize];
  const int h_mi = mi_size_high[bsize];
  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  assert(bsize >= BLOCK_8X8);
  assert(cpi->ref_frame_flags & av1_ref_frame_flag_list[LAST_FRAME] ||
         cpi->ref_frame_flags & av1_ref_frame_flag_list[ALTREF_FRAME]);

  // Setting up motion search
  const int ref_list[] = { cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME
                                                        : LAST_FRAME };
  const int num_refs = 1;
  const int use_subpixel = 1;

  // Doing whole block first to update the mv
  if (!sms_tree->sms_none_valid && features_to_get & FEATURE_SMS_NONE_FLAG) {
    simple_motion_search_get_best_ref(cpi, x, sms_tree, mi_row, mi_col, bsize,
                                      ref_list, num_refs, use_subpixel, 1,
                                      &sms_tree->sms_none_feat[0],
                                      &sms_tree->sms_none_feat[1]);
    sms_tree->sms_none_valid = 1;
  }

  // Split subblocks
  if (features_to_get & FEATURE_SMS_SPLIT_FLAG) {
    const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_SPLIT; r_idx++) {
      const int sub_mi_col = mi_col + (r_idx & 1) * w_mi / 2;
      const int sub_mi_row = mi_row + (r_idx >> 1) * h_mi / 2;
      SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[r_idx];

      if (!sub_tree->sms_none_valid) {
        simple_motion_search_get_best_ref(
            cpi, x, sub_tree, sub_mi_row, sub_mi_col, subsize, ref_list,
            num_refs, use_subpixel, 1, &sub_tree->sms_none_feat[0],
            &sub_tree->sms_none_feat[1]);
        sub_tree->sms_none_valid = 1;
      }
    }
  }

  // Rectangular subblocks
  if (!sms_tree->sms_rect_valid && features_to_get & FEATURE_SMS_RECT_FLAG) {
    // Horz subblock
    BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_HORZ);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_RECT; r_idx++) {
      const int sub_mi_col = mi_col + 0;
      const int sub_mi_row = mi_row + r_idx * h_mi / 2;

      simple_motion_search_get_best_ref(
          cpi, x, sms_tree, sub_mi_row, sub_mi_col, subsize, ref_list, num_refs,
          use_subpixel, 0, &sms_tree->sms_rect_feat[2 * r_idx],
          &sms_tree->sms_rect_feat[2 * r_idx + 1]);
    }

    // Vert subblock
    subsize = get_partition_subsize(bsize, PARTITION_VERT);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_RECT; r_idx++) {
      const int sub_mi_col = mi_col + r_idx * w_mi / 2;
      const int sub_mi_row = mi_row + 0;

      simple_motion_search_get_best_ref(
          cpi, x, sms_tree, sub_mi_row, sub_mi_col, subsize, ref_list, num_refs,
          use_subpixel, 0, &sms_tree->sms_rect_feat[4 + 2 * r_idx],
          &sms_tree->sms_rect_feat[4 + 2 * r_idx + 1]);
    }
    sms_tree->sms_rect_valid = 1;
  }

  if (!features) return;

  int f_idx = 0;
  if (features_to_get & FEATURE_SMS_NONE_FLAG) {
    for (int sub_idx = 0; sub_idx < 2; sub_idx++) {
      features[f_idx++] = log1pf((float)sms_tree->sms_none_feat[sub_idx]);
    }
  }

  if (features_to_get & FEATURE_SMS_SPLIT_FLAG) {
    for (int sub_idx = 0; sub_idx < SUB_PARTITIONS_SPLIT; sub_idx++) {
      SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[sub_idx];
      features[f_idx++] = log1pf((float)sub_tree->sms_none_feat[0]);
      features[f_idx++] = log1pf((float)sub_tree->sms_none_feat[1]);
    }
  }

  if (features_to_get & FEATURE_SMS_RECT_FLAG) {
    for (int sub_idx = 0; sub_idx < 8; sub_idx++) {
      features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[sub_idx]);
    }
  }

  const MACROBLOCKD *xd = &x->e_mbd;
  set_offsets_for_motion_search(cpi, x, mi_row, mi_col, bsize);

  // Q_INDEX
  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  features[f_idx++] = log1pf((float)(dc_q * dc_q) / 256.0f);

  // Neighbor stuff
  const int has_above = !!xd->above_mbmi;
  const int has_left = !!xd->left_mbmi;
  const BLOCK_SIZE above_bsize = has_above ? xd->above_mbmi->bsize : bsize;
  const BLOCK_SIZE left_bsize = has_left ? xd->left_mbmi->bsize : bsize;
  features[f_idx++] = (float)has_above;
  features[f_idx++] = (float)mi_size_wide_log2[above_bsize];
  features[f_idx++] = (float)mi_size_high_log2[above_bsize];
  features[f_idx++] = (float)has_left;
  features[f_idx++] = (float)mi_size_wide_log2[left_bsize];
  features[f_idx++] = (float)mi_size_high_log2[left_bsize];
}